

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImPool<ImGuiTabBar>::Clear(ImPool<ImGuiTabBar> *this)

{
  int *piVar1;
  ImGuiTabItem *pIVar2;
  ImGuiTabBar *pIVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  iVar4 = (this->Map).Data.Size;
  if (0 < iVar4) {
    lVar7 = 8;
    lVar6 = 0;
    do {
      lVar5 = (long)*(int *)((long)&((this->Map).Data.Data)->key + lVar7);
      if (lVar5 != -1) {
        pIVar2 = (this->Data).Data[lVar5].Tabs.Data;
        if (pIVar2 != (ImGuiTabItem *)0x0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
          iVar4 = (this->Map).Data.Size;
        }
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar6 < iVar4);
  }
  ImGuiStorage::Clear(&this->Map);
  pIVar3 = (this->Data).Data;
  if (pIVar3 != (ImGuiTabBar *)0x0) {
    (this->Data).Size = 0;
    (this->Data).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
    (this->Data).Data = (ImGuiTabBar *)0x0;
  }
  this->FreeIdx = 0;
  return;
}

Assistant:

void        Clear()                             { for (int n = 0; n < Map.Data.Size; n++) { int idx = Map.Data[n].val_i; if (idx != -1) Data[idx].~T(); }  Map.Clear(); Data.clear(); FreeIdx = 0; }